

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassociation.cpp
# Opt level: O1

shared_ptr<mocker::detail::ReassociationImpl::Node> __thiscall
mocker::detail::ReassociationImpl::buildTrees
          (ReassociationImpl *this,shared_ptr<mocker::ir::Addr> *node,bool firstNode)

{
  FunctionModule **this_00;
  _func_int **pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  BasicBlock *pBVar3;
  element_type *peVar4;
  bool bVar5;
  int iVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  char in_CL;
  undefined7 in_register_00000011;
  IntLiteral *addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  shared_ptr<mocker::ir::IntLiteral> sVar11;
  shared_ptr<mocker::ir::Reg> sVar12;
  shared_ptr<mocker::detail::ReassociationImpl::Node> sVar13;
  shared_ptr<mocker::ir::Reg> reg;
  undefined1 local_59;
  undefined1 local_58 [16];
  shared_ptr<mocker::ir::Addr> local_48;
  FunctionModule **local_38;
  
  addr = (IntLiteral *)CONCAT71(in_register_00000011,firstNode);
  sVar11 = ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>
                     (&local_48,addr);
  peVar4 = local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var9 = sVar11.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if ((DefUseChain *)
      local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (DefUseChain *)0x0) {
    local_58._0_4_ = Literal;
    this->bb = (BasicBlock *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::IntLiteral>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
               (allocator<mocker::detail::ReassociationImpl::Node> *)&local_59,(Type *)local_58,
               (shared_ptr<mocker::ir::IntLiteral> *)&local_48);
    _Var9._M_pi = extraout_RDX;
  }
  if (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var9._M_pi = extraout_RDX_00;
  }
  if ((DefUseChain *)peVar4 != (DefUseChain *)0x0) goto LAB_00172226;
  sVar12 = ir::dycGlobalReg((ir *)&local_48,(shared_ptr<mocker::ir::Addr> *)addr);
  peVar4 = local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var9 = sVar12.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((DefUseChain *)
      local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (DefUseChain *)0x0) {
    local_58._0_4_ = Leaf;
    this->bb = (BasicBlock *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
               (allocator<mocker::detail::ReassociationImpl::Node> *)&local_59,(Type *)local_58,
               (shared_ptr<mocker::ir::Reg> *)&local_48);
    _Var9._M_pi = extraout_RDX_01;
  }
  if (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var9._M_pi = extraout_RDX_02;
  }
  if ((DefUseChain *)peVar4 != (DefUseChain *)0x0) goto LAB_00172226;
  ir::dycLocalReg((ir *)&local_48,(shared_ptr<mocker::ir::Addr> *)addr);
  if ((DefUseChain *)
      local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (DefUseChain *)0x0) {
    __assert_fail("reg",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/reassociation.cpp"
                  ,0x41,
                  "std::shared_ptr<detail::ReassociationImpl::Node> mocker::detail::ReassociationImpl::buildTrees(const std::shared_ptr<ir::Addr> &, bool)"
                 );
  }
  bVar5 = isParameter((FunctionModule *)
                      (node->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi,
                      (string *)
                      &(((RegMap<std::vector<Use>_> *)
                        &(local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->_vptr_Addr)->_M_h)._M_bucket_count);
  if ((bVar5) ||
     (iVar6 = std::__cxx11::string::compare
                        ((char *)&(((RegMap<std::vector<Use>_> *)
                                   &(local_48.
                                     super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_Addr)->_M_h)._M_bucket_count), iVar6 == 0)) {
    local_58._0_4_ = Leaf;
    this->bb = (BasicBlock *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
               (allocator<mocker::detail::ReassociationImpl::Node> *)&local_59,(Type *)local_58,
               (shared_ptr<mocker::ir::Reg> *)&local_48);
    _Var9._M_pi = extraout_RDX_04;
  }
  else if ((in_CL == '\0') &&
          (cVar7 = std::
                   _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Reg>,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>,_std::__detail::_Identity,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Reg>,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>,_std::__detail::_Identity,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)(node + 2),(key_type *)&local_48),
          cVar7.super__Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true>._M_cur !=
          (__node_type *)0x0)) {
    local_58._0_4_ = Root;
    this->bb = (BasicBlock *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
               (allocator<mocker::detail::ReassociationImpl::Node> *)&local_59,(Type *)local_58,
               (shared_ptr<mocker::ir::Reg> *)&local_48);
    _Var9._M_pi = extraout_RDX_03;
  }
  else {
    cVar8 = std::
            _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)node[1].super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi,(key_type *)&local_48);
    if (cVar8.
        super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    pp_Var1 = *(_func_int ***)
               ((long)cVar8.
                      super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
                      ._M_cur + 0x18);
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)cVar8.
                     super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
                     ._M_cur + 0x20);
    this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)cVar8.
                      super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
                      ._M_cur + 0x28);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    if (pp_Var1 ==
        ((node->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        _vptr_Addr) {
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      bVar5 = p_Var2->_M_use_count == 5;
      p_Var10 = this_02;
      if (bVar5) {
        this_02 = this_01;
        p_Var10 = p_Var2;
      }
      if (bVar5 && this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
          p_Var10 = p_Var2;
          this_02 = this_01;
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
          p_Var10 = p_Var2;
          this_02 = this_01;
        }
      }
      if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
        }
        this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        bVar5 = p_Var2->_M_use_count == 4;
        p_Var10 = this_02;
        if (bVar5) {
          this_02 = this_01;
          p_Var10 = p_Var2;
        }
        if (bVar5 && this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
            p_Var10 = p_Var2;
            this_02 = this_01;
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
            p_Var10 = p_Var2;
            this_02 = this_01;
          }
        }
        if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          this_00 = &this->func;
          if (p_Var10[2]._M_use_count != 0) {
            local_58._0_4_ = Leaf;
            this->bb = (BasicBlock *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00,(Node **)this,
                       (allocator<mocker::detail::ReassociationImpl::Node> *)&local_59,
                       (Type *)local_58,(shared_ptr<mocker::ir::Reg> *)&local_48);
            _Var9._M_pi = extraout_RDX_09;
            goto LAB_00172569;
          }
          local_58._0_4_ = Neg;
          this->bb = (BasicBlock *)0x0;
          local_38 = this_00;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00,(Node **)this,
                     (allocator<mocker::detail::ReassociationImpl::Node> *)&local_59,
                     (Type *)local_58,(shared_ptr<mocker::ir::Reg> *)&local_48);
          pBVar3 = this->bb;
          buildTrees((ReassociationImpl *)local_58,node,(bool)((char)p_Var10 + '0'));
          std::
          vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
          ::emplace_back<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>
                    ((vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                      *)&(pBVar3->insts).
                         super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                         ._M_impl._M_node._M_size,
                     (shared_ptr<mocker::detail::ReassociationImpl::Node> *)local_58);
          _Var9._M_pi = extraout_RDX_10;
LAB_0017255a:
          if ((FunctionModule *)local_58._8_8_ != (FunctionModule *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
            _Var9._M_pi = extraout_RDX_12;
          }
          goto LAB_00172569;
        }
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
        }
        this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        bVar5 = p_Var2->_M_use_count == 3;
        p_Var10 = this_02;
        if (bVar5) {
          this_02 = this_01;
          p_Var10 = p_Var2;
        }
        if (bVar5 && this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
            p_Var10 = p_Var2;
            this_02 = this_01;
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
            p_Var10 = p_Var2;
            this_02 = this_01;
          }
        }
        if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_58._0_4_ = Assign;
          this->bb = (BasicBlock *)0x0;
          local_38 = &this->func;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_38,(Node **)this,
                     (allocator<mocker::detail::ReassociationImpl::Node> *)&local_59,
                     (Type *)local_58,(shared_ptr<mocker::ir::Reg> *)&local_48);
          pBVar3 = this->bb;
          buildTrees((ReassociationImpl *)local_58,node,(bool)((char)p_Var10 + '('));
          std::
          vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
          ::emplace_back<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>
                    ((vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                      *)&(pBVar3->insts).
                         super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                         ._M_impl._M_node._M_size,
                     (shared_ptr<mocker::detail::ReassociationImpl::Node> *)local_58);
          _Var9._M_pi = extraout_RDX_11;
          goto LAB_0017255a;
        }
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
        }
        local_58._0_4_ = Leaf;
        this->bb = (BasicBlock *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
                   (allocator<mocker::detail::ReassociationImpl::Node> *)&local_59,(Type *)local_58,
                   (shared_ptr<mocker::ir::Reg> *)&local_48);
        _Var9._M_pi = extraout_RDX_16;
      }
      else {
        if (p_Var10[2]._M_use_count - 5U < 2) {
          local_58._0_4_ = (p_Var10[2]._M_use_count != 5) + Add;
          this->bb = (BasicBlock *)0x0;
          local_38 = &this->func;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_38,(Node **)this,
                     (allocator<mocker::detail::ReassociationImpl::Node> *)&local_59,
                     (Type *)local_58,(shared_ptr<mocker::ir::Reg> *)&local_48);
          pBVar3 = this->bb;
          buildTrees((ReassociationImpl *)local_58,node,(bool)((char)p_Var10 + '0'));
          std::
          vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
          ::emplace_back<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>
                    ((vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                      *)&(pBVar3->insts).
                         super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                         ._M_impl._M_node._M_size,
                     (shared_ptr<mocker::detail::ReassociationImpl::Node> *)local_58);
          if ((FunctionModule *)local_58._8_8_ != (FunctionModule *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
          }
          pBVar3 = this->bb;
          buildTrees((ReassociationImpl *)local_58,node,(bool)((char)p_Var10 + '@'));
          std::
          vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
          ::emplace_back<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>
                    ((vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                      *)&(pBVar3->insts).
                         super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                         ._M_impl._M_node._M_size,
                     (shared_ptr<mocker::detail::ReassociationImpl::Node> *)local_58);
          _Var9._M_pi = extraout_RDX_07;
          goto LAB_0017255a;
        }
        local_58._0_4_ = Leaf;
        this->bb = (BasicBlock *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
                   (allocator<mocker::detail::ReassociationImpl::Node> *)&local_59,(Type *)local_58,
                   (shared_ptr<mocker::ir::Reg> *)&local_48);
        _Var9._M_pi = extraout_RDX_08;
LAB_00172569:
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
          _Var9._M_pi = extraout_RDX_13;
        }
      }
      if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00172217;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      _Var9._M_pi = extraout_RDX_14;
    }
    else {
      local_58._0_4_ = Leaf;
      this->bb = (BasicBlock *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
                 (allocator<mocker::detail::ReassociationImpl::Node> *)&local_59,(Type *)local_58,
                 (shared_ptr<mocker::ir::Reg> *)&local_48);
      _Var9._M_pi = extraout_RDX_06;
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      _Var9._M_pi = extraout_RDX_15;
    }
  }
LAB_00172217:
  if (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var9._M_pi = extraout_RDX_05;
  }
LAB_00172226:
  sVar13.super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var9._M_pi;
  sVar13.super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<mocker::detail::ReassociationImpl::Node>)
         sVar13.
         super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<detail::ReassociationImpl::Node>
detail::ReassociationImpl::buildTrees(const std::shared_ptr<ir::Addr> &node,
                                      bool firstNode) {
  if (auto lit = ir::dyc<ir::IntLiteral>(node)) {
    return std::make_shared<Node>(Node::Literal, lit);
  }
  if (auto gReg = ir::dycGlobalReg(node)) {
    return std::make_shared<Node>(Node::Leaf, gReg);
  }

  auto reg = ir::dycLocalReg(node);
  assert(reg);
  if (isParameter(func, reg->getIdentifier()) ||
      reg->getIdentifier() == ".phi_nan") {
    return std::make_shared<Node>(Node::Leaf, reg);
  }

  if (!firstNode && isIn(roots, reg)) {
    return std::make_shared<Node>(Node::Root, reg);
  }

  auto def = useDef.getDef(reg);
  if (def.getBBLabel() != bb.getLabelID()) {
    return std::make_shared<Node>(Node::Leaf, reg);
  }

  auto inst = def.getInst();
  if (auto binary = ir::dyc<ir::ArithBinaryInst>(inst)) {
    if (binary->getOp() != ir::ArithBinaryInst::Add &&
        binary->getOp() != ir::ArithBinaryInst::Sub) {
      return std::make_shared<Node>(Node::Leaf, reg);
    }
    auto res = std::make_shared<Node>(
        binary->getOp() == ir::ArithBinaryInst::Add ? Node::Add : Node::Sub,
        reg);
    res->children.emplace_back(buildTrees(binary->getLhs(), false));
    res->children.emplace_back(buildTrees(binary->getRhs(), false));
    return res;
  }

  if (auto unary = ir::dyc<ir::ArithUnaryInst>(inst)) {
    if (unary->getOp() != ir::ArithUnaryInst::Neg)
      return std::make_shared<Node>(Node::Leaf, reg);
    auto res = std::make_shared<Node>(Node::Neg, reg);
    res->children.emplace_back(buildTrees(unary->getOperand(), false));
    return res;
  }

  if (auto assign = ir::dyc<ir::Assign>(inst)) {
    auto res = std::make_shared<Node>(Node::Assign, reg);
    res->children.emplace_back(buildTrees(assign->getOperand(), false));
    return res;
  }

  return std::make_shared<Node>(Node::Leaf, reg);
}